

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  ScriptModule *pSVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  TokenType TVar5;
  Result RVar6;
  ScriptModule *pSVar7;
  undefined **ppuVar8;
  TokenTypePair pair;
  string name;
  Location loc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_98;
  undefined8 uStack_90;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_88,this);
  local_98.offset = (size_t)local_88.loc.field_1.field_1.offset;
  uStack_90 = local_88.loc.field_1._8_8_;
  local_a8 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename._M_len;
  uStack_a0 = local_88.loc.filename._M_str;
  RVar3 = Expect(this,Module);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_c8);
  TVar4 = Peek(this,0);
  if (TVar4 == Quote) {
    Consume(&local_88,this);
    local_88.loc.filename._M_len = 0;
    local_88.loc.filename._M_str = (char *)0x0;
    local_88.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    bVar2 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88
                            );
    if (bVar2) {
      pSVar7 = (ScriptModule *)operator_new(0x68);
      pSVar7->_vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7->type_ = 0;
      pSVar7[2]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7[2].type_ = 0;
      pSVar7[1]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7[1].type_ = 0;
      pSVar7[3]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7[3].type_ = 0;
      pSVar7[4]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7[4].type_ = 0;
      pSVar7[5]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar7[5].type_ = 0;
      pSVar7[6]._vptr_ScriptModule = (_func_int **)0x0;
      pSVar7->type_ = Quoted;
      ppuVar8 = &PTR__DataScriptModule_001a8ec0;
LAB_001459b7:
      pSVar7->_vptr_ScriptModule = (_func_int **)ppuVar8;
      *(undefined8 *)&pSVar7[1].field_0xc = 0;
      *(undefined8 *)((long)&pSVar7[2]._vptr_ScriptModule + 4) = 0;
      pSVar7[3]._vptr_ScriptModule = (_func_int **)(pSVar7 + 4);
      *(undefined8 *)&pSVar7[3].type_ = 0;
      *(undefined1 *)&pSVar7[4]._vptr_ScriptModule = 0;
      std::__cxx11::string::_M_assign((string *)(pSVar7 + 3));
      *(undefined4 *)&pSVar7[2]._vptr_ScriptModule = (undefined4)local_98.offset;
      *(undefined4 *)((long)&pSVar7[2]._vptr_ScriptModule + 4) = local_98.offset._4_4_;
      pSVar7[2].type_ = (ScriptModuleType)uStack_90;
      *(undefined4 *)&pSVar7[2].field_0xc = uStack_90._4_4_;
      *(undefined4 *)&pSVar7[1]._vptr_ScriptModule = (undefined4)local_a8;
      *(undefined4 *)((long)&pSVar7[1]._vptr_ScriptModule + 4) = local_a8._4_4_;
      pSVar7[1].type_ = (ScriptModuleType)uStack_a0;
      *(undefined4 *)&pSVar7[1].field_0xc = uStack_a0._4_4_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pSVar7 + 5),&local_88);
      pSVar1 = (out_module->_M_t).
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
      (out_module->_M_t).
      super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
      super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar7;
      if (pSVar1 != (ScriptModule *)0x0) {
        (*pSVar1->_vptr_ScriptModule[1])();
      }
    }
LAB_00145a10:
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename._M_len !=
        (anon_union_16_2_ecfd7102_for_Location_1 *)0x0) {
      operator_delete((void *)local_88.loc.filename._M_len,
                      (long)local_88.loc.field_1.field_1.offset - local_88.loc.filename._M_len);
    }
    RVar3.enum_ = Error;
    if (bVar2 == false) goto LAB_00145dcb;
  }
  else {
    if (TVar4 == Bin) {
      Consume(&local_88,this);
      local_88.loc.filename._M_len = 0;
      local_88.loc.filename._M_str = (char *)0x0;
      local_88.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      bVar2 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_88);
      if (bVar2) {
        pSVar7 = (ScriptModule *)operator_new(0x68);
        pSVar7->_vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7->type_ = 0;
        pSVar7[2]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7[2].type_ = 0;
        pSVar7[1]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7[1].type_ = 0;
        pSVar7[3]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7[3].type_ = 0;
        pSVar7[4]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7[4].type_ = 0;
        pSVar7[5]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar7[5].type_ = 0;
        pSVar7[6]._vptr_ScriptModule = (_func_int **)0x0;
        pSVar7->type_ = Binary;
        ppuVar8 = &PTR__DataScriptModule_001a8e30;
        goto LAB_001459b7;
      }
      goto LAB_00145a10;
    }
    pSVar7 = (ScriptModule *)operator_new(0x3d0);
    memset(pSVar7,0,0x3d0);
    pSVar7->type_ = Text;
    pSVar7->_vptr_ScriptModule = (_func_int **)&PTR__TextScriptModule_001a8f18;
    pSVar7[1]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[1].type_ = 0;
    *(undefined8 *)&pSVar7[1].field_0xc = 0;
    *(undefined8 *)((long)&pSVar7[2]._vptr_ScriptModule + 4) = 0;
    pSVar7[3]._vptr_ScriptModule = (_func_int **)(pSVar7 + 4);
    *(undefined8 *)&pSVar7[3].type_ = 0;
    *(undefined1 *)&pSVar7[4]._vptr_ScriptModule = 0;
    pSVar7[5]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[5].type_ = 0;
    pSVar7[6]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[6].type_ = 0;
    *(undefined8 *)&pSVar7[6].field_0xc = 0;
    *(undefined8 *)((long)&pSVar7[7]._vptr_ScriptModule + 4) = 0;
    memset(pSVar7 + 8,0,0x120);
    pSVar7[0x1a]._vptr_ScriptModule = (_func_int **)(pSVar7 + 0x1d);
    *(undefined8 *)&pSVar7[0x1a].type_ = 1;
    pSVar7[0x1b]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x1b].type_ = 0;
    *(undefined4 *)&pSVar7[0x1c]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar7[0x1c].type_ = 0;
    pSVar7[0x1d]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar7[0x1d].type_ = &pSVar7[0x20].type_;
    pSVar7[0x1e]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar7[0x1e].type_ = 0;
    pSVar7[0x1f]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar7[0x1f].type_ = 0x3f800000;
    pSVar7[0x20]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x20].type_ = 0;
    pSVar7[0x21]._vptr_ScriptModule = (_func_int **)(pSVar7 + 0x24);
    *(undefined8 *)&pSVar7[0x21].type_ = 1;
    pSVar7[0x22]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x22].type_ = 0;
    *(undefined4 *)&pSVar7[0x23]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar7[0x23].type_ = 0;
    pSVar7[0x24]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar7[0x24].type_ = &pSVar7[0x27].type_;
    pSVar7[0x25]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar7[0x25].type_ = 0;
    pSVar7[0x26]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar7[0x26].type_ = 0x3f800000;
    pSVar7[0x27]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x27].type_ = 0;
    pSVar7[0x28]._vptr_ScriptModule = (_func_int **)(pSVar7 + 0x2b);
    *(undefined8 *)&pSVar7[0x28].type_ = 1;
    pSVar7[0x29]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x29].type_ = 0;
    *(undefined4 *)&pSVar7[0x2a]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar7[0x2a].type_ = 0;
    pSVar7[0x2b]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar7[0x2b].type_ = &pSVar7[0x2e].type_;
    pSVar7[0x2c]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar7[0x2c].type_ = 0;
    pSVar7[0x2d]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar7[0x2d].type_ = 0x3f800000;
    pSVar7[0x2e]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x2e].type_ = 0;
    pSVar7[0x2f]._vptr_ScriptModule = (_func_int **)(pSVar7 + 0x32);
    *(undefined8 *)&pSVar7[0x2f].type_ = 1;
    pSVar7[0x30]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x30].type_ = 0;
    *(undefined4 *)&pSVar7[0x31]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar7[0x31].type_ = 0;
    pSVar7[0x32]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar7[0x32].type_ = &pSVar7[0x35].type_;
    pSVar7[0x33]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar7[0x33].type_ = 0;
    pSVar7[0x34]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar7[0x34].type_ = 0x3f800000;
    pSVar7[0x35]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x35].type_ = 0;
    pSVar7[0x36]._vptr_ScriptModule = (_func_int **)(pSVar7 + 0x39);
    *(undefined8 *)&pSVar7[0x36].type_ = 1;
    pSVar7[0x37]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar7[0x37].type_ = 0;
    *(undefined4 *)&pSVar7[0x38]._vptr_ScriptModule = 0x3f800000;
    pSVar7[0x3a].type_ = Text;
    pSVar7[0x3b]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined4 *)((long)&pSVar7[0x39]._vptr_ScriptModule + 7) = 0;
    *(undefined8 *)&pSVar7[0x38].type_ = 0;
    pSVar7[0x39]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar7[0x3b].type_ = &pSVar7[0x3a].type_;
    pSVar7[0x3c]._vptr_ScriptModule = (_func_int **)&pSVar7[0x3a].type_;
    *(undefined8 *)&pSVar7[0x3c].type_ = 0;
    std::__cxx11::string::_M_assign((string *)(pSVar7 + 3));
    pSVar7[2]._vptr_ScriptModule = (_func_int **)local_98.offset;
    *(undefined8 *)&pSVar7[2].type_ = uStack_90;
    pSVar7[1]._vptr_ScriptModule = (_func_int **)local_a8;
    *(char **)&pSVar7[1].type_ = uStack_a0;
    TVar4 = Peek(this,0);
    TVar5 = Peek(this,1);
    pair._M_elems[1] = TVar5;
    pair._M_elems[0] = TVar4;
    bVar2 = anon_unknown_1::IsModuleField(pair);
    if ((!bVar2) && (bVar2 = PeekIsCustom(this), !bVar2)) {
      TVar4 = Peek(this,0);
      if (TVar4 == Rpar) goto LAB_00145d02;
      Match(this,Lpar);
      local_88.loc.filename._M_len = (size_t)&local_88.loc.field_1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a module field","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_88,&local_88.token_type_);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename._M_len !=
          &local_88.loc.field_1) {
        operator_delete((void *)local_88.loc.filename._M_len,
                        (long)local_88.loc.field_1.field_1.offset + 1);
      }
LAB_00145dc2:
      (*pSVar7->_vptr_ScriptModule[1])(pSVar7);
      goto LAB_00145dcb;
    }
    RVar6 = ParseModuleFieldList(this,(Module *)(pSVar7 + 1));
    RVar3.enum_ = Error;
    if (RVar6.enum_ == Error) goto LAB_00145dc2;
LAB_00145d02:
    pSVar1 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar7;
    if (pSVar1 != (ScriptModule *)0x0) {
      (*pSVar1->_vptr_ScriptModule[1])();
    }
  }
  RVar3 = Expect(this,Rpar);
  RVar3.enum_ = (Enum)(RVar3.enum_ == Error);
LAB_00145dcb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = std::make_unique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = std::make_unique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = std::make_unique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair()) || PeekIsCustom()) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}